

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O0

void __thiscall ChatWindow::disconnectedFromServer(ChatWindow *this)

{
  QFlags<QMessageBox::StandardButton> local_50 [4];
  QString local_40;
  QString local_28;
  ChatWindow *local_10;
  ChatWindow *this_local;
  
  local_10 = this;
  tr(&local_28,"Disconnected",(char *)0x0,-1);
  tr(&local_40,"The host terminated the connection",(char *)0x0,-1);
  QFlags<QMessageBox::StandardButton>::QFlags(local_50,FirstButton);
  QMessageBox::warning
            (&this->super_QWidget,(QString *)&local_28,(QString *)&local_40,
             (QFlags_conflict1 *)(ulong)(uint)local_50[0].i,NoButton);
  QString::~QString(&local_40);
  QString::~QString(&local_28);
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x20),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x18),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x10),0));
  QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 8),0));
  QString::clear(&this->m_lastUserName);
  return;
}

Assistant:

void ChatWindow::disconnectedFromServer()
{
    // if the client loses connection to the server
    // comunicate the event to the user via a message box
    QMessageBox::warning(this, tr("Disconnected"), tr("The host terminated the connection"));
    // disable the ui to send and display messages
    ui->sendButton->setEnabled(false);
    ui->messageEdit->setEnabled(false);
    ui->chatView->setEnabled(false);
    // enable the button to connect to the server again
    ui->connectButton->setEnabled(true);
    // reset the last printed username
    m_lastUserName.clear();
}